

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O1

string * Console::
         NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::get(string *__return_storage_ptr__,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *argumentNames,uint nextName,uint requiredArguments)

{
  size_type *psVar1;
  pointer pbVar2;
  string *psVar3;
  int iVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  char *pcVar8;
  string nameT;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string *local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pcVar8 = "<int";
  local_38 = __return_storage_ptr__;
  if ((_put != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
     (iVar4 = strcmp("NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE",_put), iVar4 != 0)) {
    if (_str == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
      pcVar8 = "<float";
    }
    else {
      iVar4 = strcmp("NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE",_str);
      pcVar8 = "<string";
      if (iVar4 == 0) {
        pcVar8 = "<float";
      }
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)pcVar8);
  pbVar2 = (argumentNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)nextName;
  if ((uVar5 < (ulong)((long)(argumentNames->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) &&
     (pbVar2[uVar5]._M_string_length != 0)) {
    std::operator+(&local_98," ",pbVar2 + uVar5);
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_78);
  if (nextName == requiredArguments) {
    std::operator+(&local_98,"[",&local_78);
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_98," ",&local_78);
  NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  get(&local_58,argumentNames,nextName + 1,requiredArguments);
  psVar3 = local_38;
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    uVar7 = local_98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_58._M_string_length + local_98._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar7 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_98._M_string_length <= (ulong)uVar7) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_58,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
      goto LAB_00116800;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_58._M_dataplus._M_p);
LAB_00116800:
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar7 = puVar6[3];
    (psVar3->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&psVar3->field_2 + 8) = uVar7;
  }
  else {
    (psVar3->_M_dataplus)._M_p = (pointer)*puVar6;
    (psVar3->field_2)._M_allocated_capacity = *psVar1;
  }
  psVar3->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return psVar3;
}

Assistant:

static inline std::string get(const std::vector<std::string> &argumentNames, unsigned int nextName, unsigned int requiredArguments) {
        std::string nameT;
        if (typeid(T) == typeid(int)) {
            nameT = "<int";
        }
        else if (typeid(T) == typeid(float)) {
            nameT = "<float";
        }
        else if (typeid(T) == typeid(std::string)) {
            nameT = "<string";
        }
        else {
            nameT = "<???";
        }
        if (argumentNames.size() > nextName && !argumentNames[nextName].empty()) {
            nameT += " " + argumentNames[nextName];
        }
        nameT += ">";

        if (nextName == requiredArguments) {
            nameT = "[" + nameT;
        }

        return " " + nameT + NameArguments<Args...>::get(argumentNames, nextName + 1, requiredArguments);
    }